

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O3

void __thiscall
BVSparse<Memory::HeapAllocator>::Set(BVSparse<Memory::HeapAllocator> *this,BVIndex i)

{
  BVSparseNode *pBVar1;
  SparseBVUnit *pSVar2;
  Type_conflict *local_20;
  Type_conflict *prevNextField;
  
  local_20 = (Type_conflict *)0x0;
  pBVar1 = NodeFromIndex(this,i,&local_20,true);
  if (pBVar1 == (BVSparseNode *)0x0) {
    pSVar2 = &s_EmptyUnit;
  }
  else {
    pSVar2 = &pBVar1->data;
  }
  BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
  pSVar2->word = pSVar2->word | 1L << (sbyte)(i & 0x3f);
  return;
}

Assistant:

void
BVSparse<TAllocator>::Set(BVIndex i)
{
    this->BitsFromIndex(i)->Set(SparseBVUnit::Offset(i));
}